

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_split_clients_module.c
# Opt level: O1

char * ngx_conf_split_clients_block(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  void *pvVar1;
  ngx_pool_t *pool;
  ngx_str_t *pnVar2;
  ngx_int_t nVar3;
  ngx_stream_variable_t *pnVar4;
  u_char *puVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  ngx_conf_t *pnVar9;
  undefined8 *puVar10;
  uint *puVar11;
  uint uVar12;
  uint uVar13;
  char *pcVar14;
  byte bVar15;
  undefined8 local_c8;
  ngx_conf_t save;
  ngx_stream_compile_complex_value_t ccv;
  ngx_str_t name;
  
  bVar15 = 0;
  pnVar2 = (ngx_str_t *)ngx_pcalloc(cf->pool,0x50);
  pcVar14 = (char *)0xffffffffffffffff;
  if (pnVar2 != (ngx_str_t *)0x0) {
    pvVar1 = cf->args->elts;
    ccv.complex_value = (ngx_stream_complex_value_t *)0x0;
    ccv.cf = (ngx_conf_t *)((long)pvVar1 + 0x10);
    save.handler_conf = (char *)cf;
    ccv.value = pnVar2;
    nVar3 = ngx_stream_compile_complex_value
                      ((ngx_stream_compile_complex_value_t *)&save.handler_conf);
    if (nVar3 == 0) {
      ccv._24_8_ = *(long *)((long)pvVar1 + 0x20);
      if (**(char **)((long)pvVar1 + 0x28) == '$') {
        ccv._24_8_ = ccv._24_8_ + -1;
        pnVar4 = ngx_stream_add_variable(cf,(ngx_str_t *)&ccv.field_0x18,1);
        if (pnVar4 != (ngx_stream_variable_t *)0x0) {
          pnVar4->get_handler = ngx_stream_split_clients_variable;
          pnVar4->data = (uintptr_t)pnVar2;
          pool = cf->pool;
          pnVar2[3].len = 0;
          pnVar2[3].data = (u_char *)0x18;
          pnVar2[4].len = 2;
          pnVar2[4].data = (u_char *)pool;
          puVar5 = (u_char *)ngx_palloc(pool,0x30);
          pnVar2[2].data = puVar5;
          if (puVar5 != (u_char *)0x0) {
            pnVar9 = cf;
            puVar10 = &local_c8;
            for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
              *puVar10 = pnVar9->name;
              pnVar9 = (ngx_conf_t *)((long)pnVar9 + (ulong)bVar15 * -0x10 + 8);
              puVar10 = puVar10 + (ulong)bVar15 * -2 + 1;
            }
            cf->ctx = pnVar2;
            cf->handler = ngx_stream_split_clients;
            cf->handler_conf = (char *)conf;
            pcVar14 = ngx_conf_parse(cf,(ngx_str_t *)0x0);
            puVar10 = &local_c8;
            pnVar9 = cf;
            for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
              pnVar9->name = (char *)*puVar10;
              puVar10 = puVar10 + (ulong)bVar15 * -2 + 1;
              pnVar9 = (ngx_conf_t *)((long)pnVar9 + (ulong)bVar15 * -0x10 + 8);
            }
            if (pcVar14 == (char *)0x0) {
              sVar7 = pnVar2[3].len;
              pcVar14 = (char *)0x0;
              if (sVar7 != 0) {
                puVar11 = (uint *)pnVar2[2].data;
                uVar12 = 0;
                uVar13 = 0;
                do {
                  uVar8 = (ulong)*puVar11;
                  uVar12 = uVar12 + *puVar11;
                  if (uVar8 == 0) {
                    uVar12 = 10000;
                  }
                  if (10000 < uVar12) {
                    ngx_conf_log_error(1,cf,0,"percent total is greater than 100%%");
                    return (char *)0xffffffffffffffff;
                  }
                  if (uVar8 != 0) {
                    uVar13 = uVar13 + (int)(((uVar8 << 0x20) - uVar8) / 10000);
                    *puVar11 = uVar13;
                  }
                  puVar11 = puVar11 + 6;
                  sVar7 = sVar7 - 1;
                } while (sVar7 != 0);
              }
            }
          }
        }
      }
      else {
        ngx_conf_log_error(1,cf,0,"invalid variable name \"%V\"",&ccv.field_0x18);
      }
    }
  }
  return pcVar14;
}

Assistant:

static char *
ngx_conf_split_clients_block(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    char                                *rv;
    uint32_t                             sum, last;
    ngx_str_t                           *value, name;
    ngx_uint_t                           i;
    ngx_conf_t                           save;
    ngx_stream_variable_t               *var;
    ngx_stream_split_clients_ctx_t      *ctx;
    ngx_stream_split_clients_part_t     *part;
    ngx_stream_compile_complex_value_t   ccv;

    ctx = ngx_pcalloc(cf->pool, sizeof(ngx_stream_split_clients_ctx_t));
    if (ctx == NULL) {
        return NGX_CONF_ERROR;
    }

    value = cf->args->elts;

    ngx_memzero(&ccv, sizeof(ngx_stream_compile_complex_value_t));

    ccv.cf = cf;
    ccv.value = &value[1];
    ccv.complex_value = &ctx->value;

    if (ngx_stream_compile_complex_value(&ccv) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    name = value[2];

    if (name.data[0] != '$') {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "invalid variable name \"%V\"", &name);
        return NGX_CONF_ERROR;
    }

    name.len--;
    name.data++;

    var = ngx_stream_add_variable(cf, &name, NGX_STREAM_VAR_CHANGEABLE);
    if (var == NULL) {
        return NGX_CONF_ERROR;
    }

    var->get_handler = ngx_stream_split_clients_variable;
    var->data = (uintptr_t) ctx;

    if (ngx_array_init(&ctx->parts, cf->pool, 2,
                       sizeof(ngx_stream_split_clients_part_t))
        != NGX_OK)
    {
        return NGX_CONF_ERROR;
    }

    save = *cf;
    cf->ctx = ctx;
    cf->handler = ngx_stream_split_clients;
    cf->handler_conf = conf;

    rv = ngx_conf_parse(cf, NULL);

    *cf = save;

    if (rv != NGX_CONF_OK) {
        return rv;
    }

    sum = 0;
    last = 0;
    part = ctx->parts.elts;

    for (i = 0; i < ctx->parts.nelts; i++) {
        sum = part[i].percent ? sum + part[i].percent : 10000;
        if (sum > 10000) {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "percent total is greater than 100%%");
            return NGX_CONF_ERROR;
        }

        if (part[i].percent) {
            last += part[i].percent * (uint64_t) 0xffffffff / 10000;
            part[i].percent = last;
        }
    }

    return rv;
}